

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void evmap_signal_clear_(event_signal_map *ctx)

{
  int local_14;
  int i;
  event_signal_map *ctx_local;
  
  if (ctx->entries != (void **)0x0) {
    for (local_14 = 0; local_14 < ctx->nentries; local_14 = local_14 + 1) {
      if (ctx->entries[local_14] != (void *)0x0) {
        event_mm_free_(ctx->entries[local_14]);
      }
    }
    event_mm_free_(ctx->entries);
    ctx->entries = (void **)0x0;
  }
  ctx->nentries = 0;
  return;
}

Assistant:

void
evmap_signal_clear_(struct event_signal_map *ctx)
{
	if (ctx->entries != NULL) {
		int i;
		for (i = 0; i < ctx->nentries; ++i) {
			if (ctx->entries[i] != NULL)
				mm_free(ctx->entries[i]);
		}
		mm_free(ctx->entries);
		ctx->entries = NULL;
	}
	ctx->nentries = 0;
}